

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void CP_validateParams(SstStream Stream,SstParams Params,int Writer)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long in_RSI;
  SstStream in_RDI;
  char *SelectedModule;
  int i_3;
  int tmp;
  int i_2;
  char *SelectedTransport_1;
  int i_1;
  char *SelectedTransport;
  int i;
  int local_3c;
  int local_38;
  int local_34;
  char *local_30;
  int local_24;
  char *local_20;
  int local_18;
  long local_10;
  SstStream local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(int *)(in_RSI + 0x34) < 0) {
    fprintf(_stderr,"Invalid RendezvousReaderCount parameter value (%d) for SST Stream %s\n",
            (ulong)*(uint *)(in_RSI + 0x34),in_RDI->Filename);
  }
  else {
    in_RDI->RendezvousReaderCount = *(int *)(in_RSI + 0x34);
  }
  if (*(int *)(local_10 + 0x38) < 0) {
    fprintf(_stderr,"Invalid QueueLimit parameter value (%d) for SST Stream %s\n",
            (ulong)*(uint *)(local_10 + 0x38),local_8->Filename);
  }
  else {
    local_8->QueueLimit = *(int *)(local_10 + 0x38);
  }
  local_8->QueueFullPolicy = (SstQueueFullPolicy)*(undefined8 *)(local_10 + 0x40);
  local_8->RegistrationMethod = (SstRegistrationMethod)*(undefined8 *)(local_10 + 0x10);
  if (*(long *)(local_10 + 0x20) != 0) {
    sVar2 = strlen(*(char **)(local_10 + 0x20));
    local_20 = (char *)malloc(sVar2 + 1);
    for (local_18 = 0; *(char *)(*(long *)(local_10 + 0x20) + (long)local_18) != '\0';
        local_18 = local_18 + 1) {
      iVar1 = tolower((int)*(char *)(*(long *)(local_10 + 0x20) + (long)local_18));
      local_20[local_18] = (char)iVar1;
    }
    local_20[local_18] = '\0';
    free(*(void **)(local_10 + 0x20));
    iVar1 = strcmp(local_20,"wan");
    if ((iVar1 == 0) || (iVar1 = strcmp(local_20,"evpath"), iVar1 == 0)) {
      pcVar3 = strdup("evpath");
      *(char **)(local_10 + 0x20) = pcVar3;
    }
    else {
      iVar1 = strcmp(local_20,"rdma");
      if (((iVar1 == 0) || (iVar1 = strcmp(local_20,"ib"), iVar1 == 0)) ||
         (iVar1 = strcmp(local_20,"fabric"), iVar1 == 0)) {
        pcVar3 = strdup("rdma");
        *(char **)(local_10 + 0x20) = pcVar3;
      }
      else {
        iVar1 = strcmp(local_20,"ucx");
        if (iVar1 == 0) {
          pcVar3 = strdup("ucx");
          *(char **)(local_10 + 0x20) = pcVar3;
        }
        else {
          pcVar3 = strdup(local_20);
          *(char **)(local_10 + 0x20) = pcVar3;
        }
      }
    }
    free(local_20);
  }
  if (*(long *)(local_10 + 0x50) == 0) {
    pcVar3 = strdup("sockets");
    *(char **)(local_10 + 0x50) = pcVar3;
  }
  else {
    sVar2 = strlen(*(char **)(local_10 + 0x50));
    local_30 = (char *)malloc(sVar2 + 1);
    for (local_24 = 0; *(char *)(*(long *)(local_10 + 0x50) + (long)local_24) != '\0';
        local_24 = local_24 + 1) {
      iVar1 = tolower((int)*(char *)(*(long *)(local_10 + 0x50) + (long)local_24));
      local_30[local_24] = (char)iVar1;
    }
    local_30[local_24] = '\0';
    iVar1 = strcmp(local_30,"sockets");
    if ((iVar1 == 0) || (iVar1 = strcmp(local_30,"tcp"), iVar1 == 0)) {
      pcVar3 = strdup("sockets");
      *(char **)(local_10 + 0x50) = pcVar3;
    }
    else {
      iVar1 = strcmp(local_30,"udp");
      if (((iVar1 == 0) || (iVar1 = strcmp(local_30,"rudp"), iVar1 == 0)) ||
         ((iVar1 = strcmp(local_30,"scalable"), iVar1 == 0 ||
          (iVar1 = strcmp(local_30,"enet"), iVar1 == 0)))) {
        pcVar3 = strdup("enet");
        *(char **)(local_10 + 0x50) = pcVar3;
      }
    }
    free(local_30);
  }
  local_8->ConnectionUsleepMultiplier = 0x32;
  iVar1 = strcmp(*(char **)(local_10 + 0x50),"enet");
  if ((iVar1 == 0) && (pcVar3 = getenv("USLEEP_MULTIPLIER"), pcVar3 != (char *)0x0)) {
    pcVar3 = getenv("USLEEP_MULTIPLIER");
    __isoc99_sscanf("%d",pcVar3,&local_8->ConnectionUsleepMultiplier);
  }
  for (local_34 = 0; *(char *)(*(long *)(local_10 + 0x50) + (long)local_34) != '\0';
      local_34 = local_34 + 1) {
    iVar1 = tolower((int)*(char *)(*(long *)(local_10 + 0x50) + (long)local_34));
    *(char *)(*(long *)(local_10 + 0x50) + (long)local_34) = (char)iVar1;
  }
  iVar1 = strcmp(*(char **)(local_10 + 0x50),"enet");
  if ((iVar1 == 0) && (pcVar3 = getenv("USLEEP_MULTIPLIER"), pcVar3 != (char *)0x0)) {
    pcVar3 = getenv("USLEEP_MULTIPLIER");
    iVar1 = __isoc99_sscanf(pcVar3,"%d",&local_38);
    if (iVar1 == 1) {
      local_8->ConnectionUsleepMultiplier = local_38;
    }
    CP_verbose(local_8,PerStepVerbose,"USING %d as usleep multiplier before connections\n",
               (ulong)(uint)local_8->ConnectionUsleepMultiplier);
  }
  CP_verbose(local_8,PerStepVerbose,"Sst set to use %s as a Control Transport\n",
             *(undefined8 *)(local_10 + 0x50));
  if (*(long *)(local_10 + 0xa0) == 0) {
    pcVar3 = strdup("select");
    *(char **)(local_10 + 0xa0) = pcVar3;
  }
  else {
    sVar2 = strlen(*(char **)(local_10 + 0xa0));
    pcVar3 = (char *)malloc(sVar2 + 1);
    for (local_3c = 0; *(char *)(*(long *)(local_10 + 0xa0) + (long)local_3c) != '\0';
        local_3c = local_3c + 1) {
      iVar1 = tolower((int)*(char *)(*(long *)(local_10 + 0xa0) + (long)local_3c));
      pcVar3[local_3c] = (char)iVar1;
    }
    pcVar3[local_3c] = '\0';
    iVar1 = strcmp(pcVar3,"select");
    if (iVar1 == 0) {
      pcVar4 = strdup("select");
      *(char **)(local_10 + 0xa0) = pcVar4;
    }
    else {
      iVar1 = strcmp(pcVar3,"epoll");
      if (iVar1 == 0) {
        pcVar4 = strdup("epoll");
        *(char **)(local_10 + 0xa0) = pcVar4;
      }
      else {
        fprintf(_stderr,"Invalid ControlModule parameter (%s) for SST Stream %s\n",
                *(undefined8 *)(local_10 + 0xa0),local_8->Filename);
      }
    }
    free(pcVar3);
  }
  if (local_8->CPVerbosityLevel < *(int *)(local_10 + 8)) {
    local_8->CPVerbosityLevel = *(int *)(local_10 + 8);
  }
  else if (*(int *)(local_10 + 8) < local_8->CPVerbosityLevel) {
    *(int *)(local_10 + 8) = local_8->CPVerbosityLevel;
  }
  return;
}

Assistant:

void CP_validateParams(SstStream Stream, SstParams Params, int Writer)
{
    if (Params->RendezvousReaderCount >= 0)
    {
        Stream->RendezvousReaderCount = Params->RendezvousReaderCount;
    }
    else
    {
        fprintf(stderr,
                "Invalid RendezvousReaderCount parameter value (%d) "
                "for SST Stream %s\n",
                Params->RendezvousReaderCount, Stream->Filename);
    }
    if (Params->QueueLimit >= 0)
    {
        Stream->QueueLimit = Params->QueueLimit;
    }
    else
    {
        fprintf(stderr, "Invalid QueueLimit parameter value (%d) for SST Stream %s\n",
                Params->QueueLimit, Stream->Filename);
    }
    Stream->QueueFullPolicy = (SstQueueFullPolicy)Params->QueueFullPolicy;
    Stream->RegistrationMethod = (SstRegistrationMethod)Params->RegistrationMethod;
    if (Params->DataTransport != NULL)
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->DataTransport) + 1);
        for (i = 0; Params->DataTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->DataTransport[i]);
        }
        SelectedTransport[i] = 0;
        /* free old */
        free(Params->DataTransport);

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "wan") == 0) || (strcmp(SelectedTransport, "evpath") == 0))
        {
            Params->DataTransport = strdup("evpath");
        }
        else if ((strcmp(SelectedTransport, "rdma") == 0) ||
                 (strcmp(SelectedTransport, "ib") == 0) ||
                 (strcmp(SelectedTransport, "fabric") == 0))
        {
            Params->DataTransport = strdup("rdma");
        }
        else if (strcmp(SelectedTransport, "ucx") == 0)
        {
            Params->DataTransport = strdup("ucx");
        }
        else
        {
            Params->DataTransport = strdup(SelectedTransport);
        }
        free(SelectedTransport);
    }
    if (Params->ControlTransport == NULL)
    {
        /* determine reasonable default, now "sockets" */
        Params->ControlTransport = strdup("sockets");
    }
    else
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->ControlTransport) + 1);
        for (i = 0; Params->ControlTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->ControlTransport[i]);
        }
        SelectedTransport[i] = 0;

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "sockets") == 0) || (strcmp(SelectedTransport, "tcp") == 0))
        {
            Params->ControlTransport = strdup("sockets");
        }
        else if ((strcmp(SelectedTransport, "udp") == 0) ||
                 (strcmp(SelectedTransport, "rudp") == 0) ||
                 (strcmp(SelectedTransport, "scalable") == 0) ||
                 (strcmp(SelectedTransport, "enet") == 0))
        {
            Params->ControlTransport = strdup("enet");
        }
        free(SelectedTransport);
    }
    Stream->ConnectionUsleepMultiplier = 50;
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        sscanf("%d", getenv("USLEEP_MULTIPLIER"), &Stream->ConnectionUsleepMultiplier);
    }
    for (int i = 0; Params->ControlTransport[i] != 0; i++)
    {
        Params->ControlTransport[i] = tolower(Params->ControlTransport[i]);
    }
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        int tmp;
        if (sscanf(getenv("USLEEP_MULTIPLIER"), "%d", &tmp) == 1)
        {
            Stream->ConnectionUsleepMultiplier = tmp;
        }
        CP_verbose(Stream, PerStepVerbose, "USING %d as usleep multiplier before connections\n",
                   Stream->ConnectionUsleepMultiplier);
    }
    CP_verbose(Stream, PerStepVerbose, "Sst set to use %s as a Control Transport\n",
               Params->ControlTransport);
    if (Params->ControlModule != NULL)
    {
        int i;
        char *SelectedModule = malloc(strlen(Params->ControlModule) + 1);
        for (i = 0; Params->ControlModule[i] != 0; i++)
        {
            SelectedModule[i] = tolower(Params->ControlModule[i]);
        }
        SelectedModule[i] = 0;

        /* canonicalize SelectedModule */
        if (strcmp(SelectedModule, "select") == 0)
        {
            Params->ControlModule = strdup("select");
        }
        else if (strcmp(SelectedModule, "epoll") == 0)
        {
            Params->ControlModule = strdup("epoll");
        }
        else
        {
            fprintf(stderr, "Invalid ControlModule parameter (%s) for SST Stream %s\n",
                    Params->ControlModule, Stream->Filename);
        }
        free(SelectedModule);
    }
    else
    {
        Params->ControlModule = strdup("select");
    }
    if (Params->verbose > Stream->CPVerbosityLevel)
    {
        Stream->CPVerbosityLevel = Params->verbose;
    }
    else if (Params->verbose < Stream->CPVerbosityLevel)
    {
        Params->verbose = Stream->CPVerbosityLevel;
    }
}